

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

SchemeObject * OpenOutputPortProcedure(SchemeObject *arguments)

{
  SchemeObject *pSVar1;
  FILE *stream;
  FILE *out;
  char *filename;
  SchemeObject *arguments_local;
  
  pSVar1 = Car(arguments);
  pSVar1 = (pSVar1->data).pair.car;
  stream = fopen((char *)pSVar1,"w");
  if (stream == (FILE *)0x0) {
    fprintf(_stderr,"could not open file: \"%s\".\n",pSVar1);
    exit(1);
  }
  pSVar1 = MakeOutputPort((FILE *)stream);
  return pSVar1;
}

Assistant:

extern SchemeObject*
OpenOutputPortProcedure(SchemeObject* arguments)
{
    char* filename = Car(arguments)->data.string.value;
    FILE* out = fopen(filename, "w");

    if (out == NULL) {
        fprintf(stderr, "could not open file: \"%s\".\n", filename);
        exit(1);
    }
    return MakeOutputPort(out);
}